

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_ambush(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *ch_00;
  CClass *this;
  char *pcVar5;
  long lVar6;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    pcVar5 = "Ambush whom?\n\r";
    goto LAB_0029b242;
  }
  if (ch->fighting != (CHAR_DATA *)0x0) {
    pcVar5 = "But you\'re still fighting!\n\r";
    goto LAB_0029b242;
  }
  ch_00 = get_char_room(ch,arg);
  if (ch_00 == (CHAR_DATA *)0x0) {
    pcVar5 = "They aren\'t here.\n\r";
    goto LAB_0029b242;
  }
  bVar2 = is_affected_by(ch,0xb);
  if ((!bVar2) || (bVar2 = can_see(ch_00,ch), bVar2)) {
    pcVar5 = "But they can still see you.\n\r";
    goto LAB_0029b242;
  }
  if (ch_00 == ch) {
    pcVar5 = "That\'s just not possible.\n\r";
    goto LAB_0029b242;
  }
  bVar2 = is_safe_new(ch,ch_00,true);
  if (bVar2) {
    return;
  }
  bVar2 = check_shroud_of_light(ch,ch_00);
  if (bVar2) {
    return;
  }
  bVar2 = check_sidestep(ch,ch_00,(int)gsn_ambush,0x5f);
  if (bVar2) {
    return;
  }
  iVar3 = get_skill(ch,(int)gsn_moving_ambush);
  if (ch_00->fighting == (CHAR_DATA *)0x0) {
LAB_0029b316:
    if ((ch_00->fighting == (CHAR_DATA *)0x0) ||
       (iVar4 = number_percent(), (float)iVar4 < (float)iVar3)) {
      bVar2 = is_npc(ch);
      if (((!bVar2) && (bVar2 = is_npc(ch_00), !bVar2)) && (ch_00->fighting == (CHAR_DATA *)0x0)) {
        pcVar5 = pers(ch,ch_00);
        sprintf(buf,"Help! I\'ve been ambushed by %s!",pcVar5);
        do_myell(ch_00,buf,ch);
      }
      WAIT_STATE(ch,(int)skill_table[gsn_ambush].beats);
      iVar3 = number_percent();
      iVar4 = get_skill(ch,(int)gsn_ambush);
      if ((iVar4 <= iVar3) &&
         ((iVar3 = get_skill(ch,(int)gsn_ambush), iVar3 < 2 || (bVar2 = is_awake(ch_00), bVar2)))) {
        check_improve(ch,(int)gsn_ambush,false,1);
        damage_new(ch,ch_00,0,(int)gsn_ambush,0,true,true,0,1,(char *)0x0);
        return;
      }
      check_improve(ch,(int)gsn_ambush,true,1);
      multi_hit(ch,ch_00,(int)gsn_ambush);
      return;
    }
    pcVar5 = "You can\'t quite pin them down for your ambush.\n\r";
  }
  else {
    if (2 < iVar3) {
      sVar1 = ch->level;
      lVar6 = (long)gsn_moving_ambush;
      this = char_data::Class(ch);
      iVar4 = CClass::GetIndex(this);
      if (*(short *)(lVar6 * 0x60 + 0x45a788 + (long)iVar4 * 2) <= sVar1) goto LAB_0029b316;
    }
    pcVar5 = "They are moving around too much to ambush.\n\r";
  }
LAB_0029b242:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_ambush(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];
	float chance;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Ambush whom?\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("But you're still fighting!\n\r", ch);
		return;
	}
	else if ((victim = get_char_room(ch, arg)) == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}
	else if (!is_affected_by(ch, AFF_CAMOUFLAGE) || can_see(victim, ch))
	{
		send_to_char("But they can still see you.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That's just not possible.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_shroud_of_light(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_ambush, 95))
		return;

	chance = get_skill(ch, gsn_moving_ambush);

	if (victim->fighting != nullptr &&
		(chance < 3 || ch->level < skill_table[gsn_moving_ambush].skill_level[ch->Class()->GetIndex()]))
	{
		send_to_char("They are moving around too much to ambush.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr && number_percent() >= chance)
	{
		send_to_char("You can't quite pin them down for your ambush.\n\r", ch);
		return;
	}

	if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
	{
		sprintf(buf, "Help! I've been ambushed by %s!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	WAIT_STATE(ch, skill_table[gsn_ambush].beats);

	if ((number_percent() < get_skill(ch, gsn_ambush)) || (get_skill(ch, gsn_ambush) >= 2 && !is_awake(victim)))
	{
		check_improve(ch, gsn_ambush, true, 1);
		multi_hit(ch, victim, gsn_ambush);
	}
	else
	{
		check_improve(ch, gsn_ambush, false, 1);
		damage(ch, victim, 0, gsn_ambush, DAM_NONE, true);
	}
}